

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasAssigned::Run(void)

{
  bool bVar1;
  allocator local_31;
  FlagSaver fs;
  string value;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameExistsAndWasAssigned");
  fLI::FLAGS_test_int32 = 400;
  std::__cxx11::string::string((string *)&value,"will be changed",&local_31);
  bVar1 = GetCommandLineOption("test_int32",&value);
  if (bVar1) {
    bVar1 = std::operator==("400",&value);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&value);
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","\"400\"","==","value");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n","r");
  }
  exit(1);
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasAssigned) {
  FLAGS_test_int32 = 400;
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("400", value);
}